

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

void SexMessage(char *from,char *to,int gender,char *victim,char *killer)

{
  size_t __n;
  char *pcVar1;
  char *__s;
  long lStack_50;
  
  do {
    if (*from != '%') {
      *to = *from;
      goto LAB_00406c59;
    }
    if (9 < (byte)from[1] - 0x67) goto switchD_00406c0a_caseD_69;
    pcVar1 = from + 1;
    __s = victim;
    switch((uint)(byte)from[1]) {
    case 0x67:
      lStack_50 = 0;
      break;
    case 0x68:
      lStack_50 = 1;
      break;
    default:
      goto switchD_00406c0a_caseD_69;
    case 0x6b:
      __s = killer;
    case 0x6f:
      if (__s != (char *)0x0) {
        __n = strlen(__s);
        memcpy(to,__s,__n);
        goto LAB_00406c7b;
      }
switchD_00406c0a_caseD_69:
      *to = '%';
LAB_00406c59:
      to = to + 1;
      pcVar1 = from;
      goto LAB_00406c7e;
    case 0x70:
      lStack_50 = 2;
    }
    strcpy(to,SexMessage::genderstuff[gender][lStack_50]);
    __n = (size_t)SexMessage::gendershift[gender][lStack_50];
LAB_00406c7b:
    to = to + __n;
LAB_00406c7e:
    from = pcVar1 + 1;
    if (*pcVar1 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void SexMessage (const char *from, char *to, int gender, const char *victim, const char *killer)
{
	static const char *genderstuff[3][3] =
	{
		{ "he",  "him", "his" },
		{ "she", "her", "her" },
		{ "it",  "it",  "its" }
	};
	static const int gendershift[3][3] =
	{
		{ 2, 3, 3 },
		{ 3, 3, 3 },
		{ 2, 2, 3 }
	};
	const char *subst = NULL;

	do
	{
		if (*from != '%')
		{
			*to++ = *from;
		}
		else
		{
			int gendermsg = -1;
			
			switch (from[1])
			{
			case 'g':	gendermsg = 0;	break;
			case 'h':	gendermsg = 1;	break;
			case 'p':	gendermsg = 2;	break;
			case 'o':	subst = victim;	break;
			case 'k':	subst = killer;	break;
			}
			if (subst != NULL)
			{
				size_t len = strlen (subst);
				memcpy (to, subst, len);
				to += len;
				from++;
				subst = NULL;
			}
			else if (gendermsg < 0)
			{
				*to++ = '%';
			}
			else
			{
				strcpy (to, genderstuff[gender][gendermsg]);
				to += gendershift[gender][gendermsg];
				from++;
			}
		}
	} while (*from++);
}